

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::render_const_value
          (string *__return_storage_ptr__,t_cpp_generator *this,ostream *out,string *name,
          t_type *type,t_const_value *value)

{
  uint uVar1;
  t_const_value_type tVar2;
  int64_t iVar3;
  ostream *poVar4;
  char *pcVar5;
  double value_00;
  undefined1 auVar6 [12];
  string local_2d0;
  string local_2b0;
  allocator local_289;
  string local_288;
  undefined1 local_268 [8];
  string t;
  string local_220;
  string local_200;
  string local_1e0;
  t_base local_1c0;
  t_base tbase;
  undefined1 local_1b0 [8];
  ostringstream render;
  t_const_value *value_local;
  t_type *type_local;
  string *name_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  render._368_8_ = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  uVar1 = (*(type->super_t_doc)._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(type->super_t_doc)._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,"tmp",&local_289);
      t_generator::tmp((string *)local_268,(t_generator *)this,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      poVar4 = t_generator::indent((t_generator *)this,out);
      type_name_abi_cxx11_(&local_2b0,this,type,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_2b0);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)local_268);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::string((string *)&local_2d0,(string *)local_268);
      print_const_value(this,out,&local_2d0,type,(t_const_value *)render._368_8_);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::operator<<((ostream *)local_1b0,(string *)local_268);
      std::__cxx11::string::~string((string *)local_268);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1b0,"(");
      type_name_abi_cxx11_((string *)((long)&t.field_2 + 8),this,type,false,false);
      poVar4 = std::operator<<(poVar4,(string *)(t.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,")");
      iVar3 = t_const_value::get_integer((t_const_value *)render._368_8_);
      std::ostream::operator<<(poVar4,iVar3);
      std::__cxx11::string::~string((string *)(t.field_2._M_local_buf + 8));
    }
  }
  else {
    local_1c0 = t_base_type::get_base((t_base_type *)type);
    switch(local_1c0) {
    case TYPE_STRING:
      poVar4 = std::operator<<((ostream *)local_1b0,'\"');
      t_generator::get_escaped_string_abi_cxx11_
                (&local_1e0,(t_generator *)this,(t_const_value *)render._368_8_);
      poVar4 = std::operator<<(poVar4,(string *)&local_1e0);
      std::operator<<(poVar4,'\"');
      std::__cxx11::string::~string((string *)&local_1e0);
      break;
    case TYPE_BOOL:
      iVar3 = t_const_value::get_integer((t_const_value *)render._368_8_);
      pcVar5 = "false";
      if (0 < iVar3) {
        pcVar5 = "true";
      }
      std::operator<<((ostream *)local_1b0,pcVar5);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
      iVar3 = t_const_value::get_integer((t_const_value *)render._368_8_);
      std::ostream::operator<<(local_1b0,iVar3);
      break;
    case TYPE_I64:
      iVar3 = t_const_value::get_integer((t_const_value *)render._368_8_);
      poVar4 = (ostream *)std::ostream::operator<<(local_1b0,iVar3);
      std::operator<<(poVar4,"LL");
      break;
    case TYPE_DOUBLE:
      tVar2 = t_const_value::get_type((t_const_value *)render._368_8_);
      if (tVar2 == CV_INTEGER) {
        poVar4 = std::operator<<((ostream *)local_1b0,"static_cast<double>(");
        iVar3 = t_const_value::get_integer((t_const_value *)render._368_8_);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
        std::operator<<(poVar4,")");
      }
      else {
        value_00 = t_const_value::get_double((t_const_value *)render._368_8_);
        t_generator::emit_double_as_string_abi_cxx11_(&local_200,(t_generator *)this,value_00);
        std::operator<<((ostream *)local_1b0,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
      }
      break;
    default:
      auVar6 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)local_1c0,auVar6._8_4_);
      std::operator+(auVar6._0_8_,"compiler error: no const of base type ",&local_220);
      __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::render_const_value(ostream& out,
                                           string name,
                                           t_type* type,
                                           t_const_value* value) {
  (void)name;
  std::ostringstream render;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      render << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      render << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      render << value->get_integer();
      break;
    case t_base_type::TYPE_I64:
      render << value->get_integer() << "LL";
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        render << "static_cast<double>(" << value->get_integer() << ")";
      } else {
        render << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    render << "(" << type_name(type) << ")" << value->get_integer();
  } else {
    string t = tmp("tmp");
    indent(out) << type_name(type) << " " << t << ";" << endl;
    print_const_value(out, t, type, value);
    render << t;
  }

  return render.str();
}